

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processAttributes
          (PSVIWriterHandlers *this,PSVIAttributeList *psviAttributes,
          RefVectorOf<AttrInfo> *attributesInfo)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  bool bVar1;
  XMLCh *pXVar2;
  AttrInfo *pAVar3;
  XMLCh *pXVar4;
  char16_t *value;
  long lVar5;
  PSVIItem *this_01;
  PSVIAttribute *attrPSVI;
  PSVIAttribute *psviAttr;
  XMLCh *namespaceUri;
  XMLCh *localName;
  XMLSize_t i;
  BaseRefVectorOf<AttrInfo> *pBStack_20;
  bool firstFlag;
  RefVectorOf<AttrInfo> *attributesInfo_local;
  PSVIAttributeList *psviAttributes_local;
  PSVIWriterHandlers *this_local;
  
  pBStack_20 = &attributesInfo->super_BaseRefVectorOf<AttrInfo>;
  attributesInfo_local = (RefVectorOf<AttrInfo> *)psviAttributes;
  psviAttributes_local = (PSVIAttributeList *)this;
  xercesc_4_0::ValueVectorOf<unsigned_long>::removeAllElements(this->fNSAttributes);
  i._7_1_ = 1;
  localName = (XMLCh *)0x0;
  do {
    pXVar4 = localName;
    pXVar2 = (XMLCh *)xercesc_4_0::BaseRefVectorOf<AttrInfo>::size(pBStack_20);
    if (pXVar2 <= pXVar4) {
      if ((i._7_1_ & 1) == 0) {
        sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
      }
      else {
        writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
      }
      processNamespaceAttributes
                (this,(PSVIAttributeList *)attributesInfo_local,(RefVectorOf<AttrInfo> *)pBStack_20)
      ;
      return;
    }
    pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt(pBStack_20,(XMLSize_t)localName);
    pXVar4 = AttrInfo::getUri(pAVar3);
    if (pXVar4 == (XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName) {
      xercesc_4_0::ValueVectorOf<unsigned_long>::addElement
                (this->fNSAttributes,(unsigned_long *)&localName);
    }
    else {
      if ((i._7_1_ & 1) != 0) {
        sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
        i._7_1_ = 0;
      }
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt(pBStack_20,(XMLSize_t)localName);
      pXVar4 = AttrInfo::getLocalName(pAVar3);
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt(pBStack_20,(XMLSize_t)localName);
      pXVar2 = AttrInfo::getUri(pAVar3);
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar2);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar4);
      this_00 = this->fPrefixMap;
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt(pBStack_20,(XMLSize_t)localName);
      pXVar2 = AttrInfo::getUri(pAVar3);
      value = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this_00,pXVar2);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,value);
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt(pBStack_20,(XMLSize_t)localName);
      pXVar2 = AttrInfo::getValue(pAVar3);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar2);
      if (attributesInfo_local == (RefVectorOf<AttrInfo> *)0x0) {
LAB_00116db3:
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,
                         (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown);
      }
      else {
        lVar5 = xercesc_4_0::PSVIAttributeList::getAttributePSVIAtIndex((ulong)attributesInfo_local)
        ;
        if (lVar5 == 0) goto LAB_00116db3;
        this_01 = (PSVIItem *)
                  xercesc_4_0::PSVIAttributeList::getAttributePSVIAtIndex
                            ((ulong)attributesInfo_local);
        bVar1 = xercesc_4_0::PSVIItem::getIsSchemaSpecified(this_01);
        pXVar2 = translateBool(this,(bool)((bVar1 ^ 0xffU) & 1));
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar2);
      }
      pAVar3 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt(pBStack_20,(XMLSize_t)localName);
      pXVar2 = AttrInfo::getType(pAVar3);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar2);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      attrPSVI = (PSVIAttribute *)
                 xercesc_4_0::PSVIAttributeList::getAttributePSVIByName
                           ((wchar16 *)attributesInfo_local,pXVar4);
      processAttributePSVI(this,attrPSVI);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
    }
    localName = (XMLCh *)((long)localName + 1);
  } while( true );
}

Assistant:

void PSVIWriterHandlers::processAttributes(PSVIAttributeList* psviAttributes, const RefVectorOf<AttrInfo>* attributesInfo) {
	fNSAttributes->removeAllElements();  //will store the indecies of namespace attributes
	bool firstFlag = true;
	for (XMLSize_t i = 0; i < attributesInfo->size(); i++) {
		if (attributesInfo->elementAt(i)->getUri() == XMLUni::fgXMLNSURIName) {
			fNSAttributes->addElement(i);
		} else {
			if (firstFlag) {
				sendIndentedElement(PSVIUni::fgAttributes);
				firstFlag = false;
			}
			const XMLCh* localName = attributesInfo->elementAt(i)->getLocalName();
			const XMLCh* namespaceUri = attributesInfo->elementAt(i)->getUri();
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, namespaceUri);
			sendElementValue(PSVIUni::fgLocalName, localName);
			sendElementValue(PSVIUni::fgPrefix, fPrefixMap->get(attributesInfo->elementAt(i)->getUri()));
			sendElementValue(PSVIUni::fgNormalizedValue, attributesInfo->elementAt(i)->getValue());
			if (psviAttributes!=NULL && psviAttributes->getAttributePSVIAtIndex(i)!=NULL) {
				sendElementValue(PSVIUni::fgSpecified,
					translateBool(!(psviAttributes->getAttributePSVIAtIndex(i)->getIsSchemaSpecified())));
			} else //the desired value is !schemaSpecified
				sendElementValue(PSVIUni::fgSpecified, PSVIUni::fgUnknown);
			sendElementValue(PSVIUni::fgAttributeType, attributesInfo->elementAt(i)->getType());
			sendElementEmpty(PSVIUni::fgReferences);
			PSVIAttribute* psviAttr = psviAttributes->getAttributePSVIByName(localName, namespaceUri);
			processAttributePSVI(psviAttr);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
	}
	if (firstFlag)
		writeEmpty(PSVIUni::fgAttributes);
	else
		sendUnindentedElement(PSVIUni::fgAttributes);
	processNamespaceAttributes(psviAttributes, attributesInfo);
}